

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
spoa::Graph::GenerateMultipleSequenceAlignment_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Graph *this,bool include_consensus)

{
  value_type vVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppNVar5;
  reference pvVar6;
  undefined1 *puVar7;
  reference ppNVar8;
  Node **it_1;
  iterator __end2;
  iterator __begin2;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range2;
  undefined1 local_a0 [8];
  string row_1;
  value_type it;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string row;
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> node_id_to_column;
  uint32_t row_size;
  bool include_consensus_local;
  Graph *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dst;
  
  node_id_to_column.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  node_id_to_column.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = include_consensus;
  InitializeMultipleSequenceAlignment
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,this,
             (uint32_t *)
             &node_id_to_column.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  row.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  for (row.field_2._8_4_ = 0; uVar3 = (ulong)(uint)row.field_2._8_4_,
      sVar4 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size
                        (&this->sequences_), uVar3 < sVar4;
      row.field_2._8_4_ = row.field_2._8_4_ + 1) {
    uVar3 = (ulong)(uint)node_id_to_column.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_60,uVar3,'-',&local_61);
    std::allocator<char>::~allocator(&local_61);
    ppNVar5 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                        (&this->sequences_,(ulong)(uint)row.field_2._8_4_);
    row_1.field_2._8_8_ = *ppNVar5;
    do {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->decoder_,(ulong)*(uint *)(row_1.field_2._8_8_ + 4));
      vVar1 = *pvVar6;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                 (ulong)*(uint *)row_1.field_2._8_8_);
      puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_60);
      *puVar7 = (char)vVar1;
      row_1.field_2._8_8_ = (size_type)Node::Successor(row_1.field_2._8_8_,row.field_2._8_4_);
    } while ((Node *)row_1.field_2._8_8_ != (Node *)0x0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::__cxx11::string::~string((string *)local_60);
  }
  if ((node_id_to_column.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    TraverseHeaviestBundle(this);
    uVar3 = (ulong)(uint)node_id_to_column.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,uVar3,'-',(allocator<char> *)((long)&__range2 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin
                       (&this->consensus_);
    it_1 = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::end
                              (&this->consensus_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                       *)&it_1), bVar2) {
      ppNVar8 = __gnu_cxx::
                __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                ::operator*(&__end2);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->decoder_,(ulong)(*ppNVar8)->code);
      vVar1 = *pvVar6;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(ulong)(*ppNVar8)->id);
      puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_a0);
      *puVar7 = (char)vVar1;
      __gnu_cxx::
      __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
  }
  row.field_2._M_local_buf[0xf] = '\x01';
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Graph::GenerateMultipleSequenceAlignment(
    bool include_consensus) {
  std::uint32_t row_size = 0;
  auto node_id_to_column = InitializeMultipleSequenceAlignment(&row_size);

  std::vector<std::string> dst;
  for (std::uint32_t i = 0; i < sequences_.size(); ++i) {
    std::string row(row_size, '-');
    auto it = sequences_[i];
    while (true) {
      row[node_id_to_column[it->id]] = decoder_[it->code];
      if (!(it = it->Successor(i))) {
        break;
      }
    }
    dst.emplace_back(row);
  }
  if (include_consensus) {
    TraverseHeaviestBundle();
    std::string row(row_size, '-');
    for (const auto& it : consensus_) {
      row[node_id_to_column[it->id]] = decoder_[it->code];
    }
    dst.emplace_back(row);
  }

  return dst;
}